

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

int lws_timingsafe_bcmp(void *a,void *b,uint32_t len)

{
  long lVar1;
  byte bVar2;
  uint8_t *pb;
  uint8_t *pa;
  
  bVar2 = 0;
  for (lVar1 = 0; len != (uint32_t)lVar1; lVar1 = lVar1 + 1) {
    bVar2 = bVar2 | *(byte *)((long)b + lVar1) ^ *(byte *)((long)a + lVar1);
  }
  return (uint)bVar2;
}

Assistant:

int
lws_timingsafe_bcmp(const void *a, const void *b, uint32_t len)
{
	const uint8_t *pa = a, *pb = b;
	uint8_t sum = 0;

	while (len--)
		sum |= (uint8_t)(*pa++ ^ *pb++);

	return sum;
}